

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMostDenseSeeds.cpp
# Opt level: O0

void RandomTrial(uint N,uint count,uint64_t seed,uint16_t d_seed,uint trial)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint16_t in_CX;
  uint16_t in_SI;
  WirehairResult result;
  Codec codec;
  uint16_t p_seed;
  PCGRandom prng;
  uint16_t dense_count;
  Codec *this;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  PCGRandom *in_stack_fffffffffffffeb0;
  Codec *this_00;
  WirehairResult local_148;
  Codec local_138;
  uint16_t local_32;
  uint16_t local_1a;
  uint16_t local_12;
  
  this = (Codec *)&stack0xffffffffffffffd0;
  local_1a = in_SI;
  local_12 = in_CX;
  siamese::PCGRandom::PCGRandom((PCGRandom *)this);
  siamese::PCGRandom::Seed
            (in_stack_fffffffffffffeb0,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
             ,(uint64_t)this);
  uVar1 = siamese::PCGRandom::Next((PCGRandom *)this);
  uVar2 = siamese::PCGRandom::Next((PCGRandom *)this);
  local_32 = (ushort)uVar1 ^ (ushort)uVar2;
  this_00 = &local_138;
  wirehair::Codec::Codec(this_00);
  wirehair::Codec::OverrideSeeds(this_00,local_1a,local_32,local_12);
  local_148 = wirehair::Codec::InitializeEncoder
                        (this_00,CONCAT44(uVar1,in_stack_fffffffffffffea8),
                         (uint)((ulong)this >> 0x20));
  if (local_148 == Wirehair_Success) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&message,0);
    local_148 = wirehair::Codec::EncodeFeed((Codec *)CONCAT44(uVar1,in_stack_fffffffffffffea8),this)
    ;
  }
  if (local_148 != Wirehair_Success) {
    std::__atomic_base<unsigned_int>::operator++(&FailedTrials.super___atomic_base<unsigned_int>,0);
  }
  wirehair::Codec::~Codec(this);
  return;
}

Assistant:

static void RandomTrial(
    unsigned N,
    unsigned count,
    uint64_t seed,
    const uint16_t d_seed,
    unsigned trial)
{
    const uint16_t dense_count = (uint16_t)count;

    siamese::PCGRandom prng;
    prng.Seed(seed, trial);

    const uint16_t p_seed = (uint16_t)(prng.Next() ^ prng.Next());

    wirehair::Codec codec;

    // Override the seeds
    codec.OverrideSeeds(dense_count, p_seed, d_seed);

    // Initialize codec
    WirehairResult result = codec.InitializeEncoder(N, 1);

    // If initialization succeeded:
    if (result == Wirehair_Success) {
        // Feed message to codec
        result = codec.EncodeFeed(&message[0]);
    }

    if (result != Wirehair_Success) {
        FailedTrials++;
    }
}